

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O0

void __thiscall
CAMFImporter_NodeElement_TexMap::CAMFImporter_NodeElement_TexMap
          (CAMFImporter_NodeElement_TexMap *this,CAMFImporter_NodeElement *pParent)

{
  aiVector3t<float> *local_20;
  CAMFImporter_NodeElement *pParent_local;
  CAMFImporter_NodeElement_TexMap *this_local;
  
  CAMFImporter_NodeElement::CAMFImporter_NodeElement
            (&this->super_CAMFImporter_NodeElement,ENET_TexMap,pParent);
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_TexMap_00f3fc40;
  local_20 = this->TextureCoordinate;
  do {
    aiVector3t<float>::aiVector3t(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (aiVector3t<float> *)&this->field_0x74);
  std::__cxx11::string::string((string *)&this->TextureID_R);
  std::__cxx11::string::string((string *)&this->TextureID_G);
  std::__cxx11::string::string((string *)&this->TextureID_B);
  std::__cxx11::string::string((string *)&this->TextureID_A);
  return;
}

Assistant:

CAMFImporter_NodeElement_TexMap(CAMFImporter_NodeElement* pParent)
	: CAMFImporter_NodeElement(ENET_TexMap, pParent)
    , TextureCoordinate{}
    , TextureID_R()
    , TextureID_G()
    , TextureID_B()
    , TextureID_A()	{
        // empty
    }